

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

int asl::myatoi(char *s)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 1;
  if (*s == '+') {
    s = s + 1;
  }
  else if (*s == '-') {
    s = s + 1;
    iVar2 = -1;
  }
  iVar1 = 0;
  for (; (byte)(*s - 0x30U) < 10; s = (char *)((byte *)s + 1)) {
    iVar1 = iVar1 * 10 + (uint)(byte)*s + -0x30;
  }
  return iVar1 * iVar2;
}

Assistant:

int myatoi(const char* s)
{
	int y = 0, sgn = 1;
	if (s[0] == '-') { sgn = -1; s++; }
	else if (s[0] == '+') s++;
	int c;
	while (c = *s++, c >= '0' && c <= '9')
		y = 10 * y + (c - '0');
	return y*sgn;
}